

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O2

_Bool round_to_inf(float_status *fpst,_Bool sign_bit)

{
  switch(fpst->float_rounding_mode) {
  case '\0':
    sign_bit = true;
    break;
  case '\x01':
    break;
  case '\x02':
    sign_bit = !sign_bit;
    break;
  case '\x03':
    sign_bit = false;
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/vfp_helper.c"
               ,0x2c3,(char *)0x0);
  }
  return sign_bit;
}

Assistant:

static bool round_to_inf(float_status *fpst, bool sign_bit)
{
    switch (fpst->float_rounding_mode) {
    case float_round_nearest_even: /* Round to Nearest */
        return true;
    case float_round_up: /* Round to +Inf */
        return !sign_bit;
    case float_round_down: /* Round to -Inf */
        return sign_bit;
    case float_round_to_zero: /* Round to Zero */
        return false;
    }

    g_assert_not_reached();
    // never reach here
    return false;
}